

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_circle.cpp
# Opt level: O0

double __thiscall ON_Circle::EquationAt(ON_Circle *this,ON_2dPoint *p)

{
  double dVar1;
  double dVar2;
  double y;
  double x;
  double e;
  ON_2dPoint *p_local;
  ON_Circle *this_local;
  
  if ((this->radius != 0.0) || (NAN(this->radius))) {
    dVar1 = p->x / this->radius;
    dVar2 = p->y / this->radius;
    x = (dVar1 * dVar1 + dVar2 * dVar2) - 1.0;
  }
  else {
    x = 0.0;
  }
  return x;
}

Assistant:

double ON_Circle::EquationAt( 
                 const ON_2dPoint& p // coordinates in plane
                 ) const
{
  double e, x, y;
  if ( radius != 0.0 ) {
    x = p.x/radius;
    y = p.y/radius;
    e = x*x + y*y - 1.0;
  }
  else {
    e = 0.0;
  }
  return e;
}